

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall ShadingPass::ShadingPass(ShadingPass *this,uint width,uint height)

{
  uint uVar1;
  allocator<char> local_105;
  uint attachments [1];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"shaders/final.vert",(allocator<char> *)attachments);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"shaders/draw.frag",&local_105);
  Shader::Shader(&this->draw_program,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"shaders/final.vert",(allocator<char> *)attachments);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"shaders/final.frag",&local_105);
  Shader::Shader(&this->shading_program,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"shaders/skybox.vert",(allocator<char> *)attachments);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"shaders/skybox.frag",&local_105);
  Shader::Shader(&this->skybox_program,&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  attachments[0] = 0x8ce0;
  (*gl3wProcs.ptr[0xac])(1,&this->fbo);
  (*gl3wProcs.ptr[0xf])(0x8d40,(ulong)this->fbo);
  uVar1 = create_texture(width,height,0x8815,0x1907);
  this->shading_tex = uVar1;
  (*gl3wProcs.ptr[0xa7])(0x8d40,0x8ce0,0xde1,(ulong)uVar1,0);
  (*gl3wProcs.ptr[0x88])(1,attachments);
  (*gl3wProcs.ptr[0xf])(0x8d40,0);
  uVar1 = createSkyboxVAO();
  this->cube_vao = uVar1;
  this->ambient_intensity = 1.0;
  this->shadow_bias = 1e-08;
  this->use_pcf = true;
  this->frame_num = 0;
  this->pcf_radius = 3.0;
  this->skybox_choice = 0;
  return;
}

Assistant:

ShadingPass::ShadingPass(unsigned int width, unsigned int height)
    : draw_program("shaders/final.vert", "shaders/draw.frag")
    , shading_program("shaders/final.vert", "shaders/final.frag")
    , skybox_program("shaders/skybox.vert", "shaders/skybox.frag")
{
    unsigned int attachments[1] = { GL_COLOR_ATTACHMENT0 };
    glGenFramebuffers(1, &fbo);
    glBindFramebuffer(GL_FRAMEBUFFER, fbo);
    shading_tex = create_texture(width, height, GL_RGB32F, GL_RGB);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, shading_tex, 0);
    glDrawBuffers(1, attachments);
    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    cube_vao = createSkyboxVAO();

    ambient_intensity = 1.f;
    shadow_bias = 1e-8;
    use_pcf = true;
    pcf_radius = 3;

    frame_num = 0;

    skybox_choice = 0;
}